

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Diagnostics.cc
# Opt level: O1

DifferenceReport *
flow::diagnostics::difference
          (DifferenceReport *__return_storage_ptr__,BufferedReport *first,BufferedReport *second)

{
  Message *pMVar1;
  Message *pMVar2;
  pointer pMVar3;
  bool bVar4;
  Message *m;
  Message *pMVar5;
  pointer other;
  Message *this;
  BufferedReport *__range2;
  bool bVar6;
  
  (__return_storage_ptr__->second).
  super__Vector_base<flow::diagnostics::Message,_std::allocator<flow::diagnostics::Message>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->second).
  super__Vector_base<flow::diagnostics::Message,_std::allocator<flow::diagnostics::Message>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->first).
  super__Vector_base<flow::diagnostics::Message,_std::allocator<flow::diagnostics::Message>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->second).
  super__Vector_base<flow::diagnostics::Message,_std::allocator<flow::diagnostics::Message>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->first).
  super__Vector_base<flow::diagnostics::Message,_std::allocator<flow::diagnostics::Message>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->first).
  super__Vector_base<flow::diagnostics::Message,_std::allocator<flow::diagnostics::Message>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pMVar1 = (first->messages_).
           super__Vector_base<flow::diagnostics::Message,_std::allocator<flow::diagnostics::Message>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pMVar5 = (first->messages_).
                super__Vector_base<flow::diagnostics::Message,_std::allocator<flow::diagnostics::Message>_>
                ._M_impl.super__Vector_impl_data._M_start; pMVar5 != pMVar1; pMVar5 = pMVar5 + 1) {
    this = (second->messages_).
           super__Vector_base<flow::diagnostics::Message,_std::allocator<flow::diagnostics::Message>_>
           ._M_impl.super__Vector_impl_data._M_start;
    pMVar2 = (second->messages_).
             super__Vector_base<flow::diagnostics::Message,_std::allocator<flow::diagnostics::Message>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    bVar6 = this != pMVar2;
    if (bVar6) {
      bVar4 = Message::operator==(this,pMVar5);
      while (!bVar4) {
        this = this + 1;
        bVar6 = this != pMVar2;
        if (this == pMVar2) break;
        bVar4 = Message::operator==(this,pMVar5);
      }
    }
    if (!bVar6) {
      std::vector<flow::diagnostics::Message,_std::allocator<flow::diagnostics::Message>_>::
      push_back(&__return_storage_ptr__->first,pMVar5);
    }
  }
  other = (second->messages_).
          super__Vector_base<flow::diagnostics::Message,_std::allocator<flow::diagnostics::Message>_>
          ._M_impl.super__Vector_impl_data._M_start;
  pMVar3 = (second->messages_).
           super__Vector_base<flow::diagnostics::Message,_std::allocator<flow::diagnostics::Message>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (other != pMVar3) {
    do {
      pMVar5 = (first->messages_).
               super__Vector_base<flow::diagnostics::Message,_std::allocator<flow::diagnostics::Message>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pMVar1 = (first->messages_).
               super__Vector_base<flow::diagnostics::Message,_std::allocator<flow::diagnostics::Message>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      bVar6 = pMVar5 != pMVar1;
      if (bVar6) {
        bVar4 = Message::operator==(pMVar5,other);
        while (!bVar4) {
          pMVar5 = pMVar5 + 1;
          bVar6 = pMVar5 != pMVar1;
          if (pMVar5 == pMVar1) break;
          bVar4 = Message::operator==(pMVar5,other);
        }
      }
      if (!bVar6) {
        std::vector<flow::diagnostics::Message,_std::allocator<flow::diagnostics::Message>_>::
        push_back(&__return_storage_ptr__->second,other);
      }
      other = other + 1;
    } while (other != pMVar3);
  }
  return __return_storage_ptr__;
}

Assistant:

DifferenceReport difference(const BufferedReport& first, const BufferedReport& second) {
  DifferenceReport diff;

  for (const Message& m: first)
    if (!second.contains(m))
      diff.first.push_back(m);

  for (const Message& m: second)
    if (!first.contains(m))
      diff.second.push_back(m);

  return diff;
}